

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionGenerator.cpp
# Opt level: O3

void __thiscall InstructionGenerator::genGoto(InstructionGenerator *this,uint pos)

{
  pointer puVar1;
  iterator iVar2;
  vector<unsigned_int,std::allocator<unsigned_int>> *this_00;
  Instruction local_18;
  uint local_14;
  
  this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)this->bytecode;
  _local_18 = CONCAT44(pos,5);
  iVar2._M_current = *(uint **)(this_00 + 8);
  puVar1 = *(pointer *)(this_00 + 0x10);
  if (iVar2._M_current == puVar1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<Instruction>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,iVar2,&local_18);
    this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)this->bytecode;
    iVar2._M_current = *(uint **)(this_00 + 8);
    puVar1 = *(pointer *)(this_00 + 0x10);
  }
  else {
    *iVar2._M_current = 5;
    iVar2._M_current = iVar2._M_current + 1;
    *(uint **)(this_00 + 8) = iVar2._M_current;
  }
  if (iVar2._M_current == puVar1) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int&>
              (this_00,iVar2,&local_14);
  }
  else {
    *iVar2._M_current = pos;
    *(uint **)(this_00 + 8) = iVar2._M_current + 1;
  }
  return;
}

Assistant:

void InstructionGenerator::genGoto(unsigned int pos)
{
    bytecode->emplace_back(Instruction::GOTO);
    bytecode->emplace_back(pos);
}